

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfilnam.cpp
# Opt level: O1

char * CVmObjFileName::get_local_path(vm_val_t *val)

{
  int iVar1;
  char *pcVar2;
  
  if (val->typ == VM_OBJ) {
    iVar1 = (**(code **)(*(long *)&G_obj_table_X.pages_[(val->val).obj >> 0xc]
                                   [(val->val).obj & 0xfff].ptr_ + 8))
                      (G_obj_table_X.pages_[(val->val).obj >> 0xc] + ((val->val).obj & 0xfff),
                       metaclass_reg_);
    if (iVar1 != 0) {
      pcVar2 = (G_obj_table_X.pages_[(val->val).obj >> 0xc]->ptr_).obj_ +
               ((val->val).obj & 0xfff) * 0x18;
      goto LAB_0028827d;
    }
  }
  pcVar2 = (char *)0x0;
LAB_0028827d:
  if (pcVar2 != (char *)0x0) {
    return (char *)(*(long *)(pcVar2 + 8) + 6);
  }
  pcVar2 = vm_val_t::get_as_string(val);
  return pcVar2;
}

Assistant:

const char *CVmObjFileName::get_local_path(VMG_ const vm_val_t *val)
{
    CVmObjFileName *fn;
    const char *str;
    if ((fn = vm_val_cast(CVmObjFileName, val)) != 0)
    {
        /* it's a FileName object - return a copy of its filename string */
        return fn->get_ext()->str;
    }
    else if ((str = val->get_as_string(vmg0_)) != 0)
    {
        /* it's a string, so convert from URL notation to local path syntax */
        return str;
    }
    else
    {
        /* it's not a string or FileName */
        return 0;
    }
}